

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Reduce(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *p;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fDualOut;
  int fUseAll;
  int fVerbose;
  int c;
  Gia_Man_t *pTemp2;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fDualOut = 0;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_002aba9f:
  iVar1 = Extra_UtilGetopt(argc,argv,"advh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Reduce(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (local_44 == 0) {
        pTemp2 = Gia_ManEquivReduceAndRemap(pAbc->pGia,1,local_48);
      }
      else {
        p = Gia_ManEquivReduce(pAbc->pGia,local_44,local_48,0,fDualOut);
        pTemp2 = Gia_ManSeqStructSweep(p,1,1,0);
        Gia_ManStop(p);
      }
      Abc_FrameUpdateGia(pAbc,pTemp2);
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x61:
    local_44 = local_44 ^ 1;
    goto LAB_002aba9f;
  default:
    break;
  case 100:
    local_48 = local_48 ^ 1;
    goto LAB_002aba9f;
  case 0x68:
    break;
  case 0x76:
    goto switchD_002abadd_caseD_76;
  }
  Abc_Print(-2,"usage: &reduce [-advh]\n");
  Abc_Print(-2,"\t         reduces the circuit using equivalence classes\n");
  pcVar2 = "no";
  if (local_44 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle merging all equivalences [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_48 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-d     : toggle using dual-output merging [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (fDualOut != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002abadd_caseD_76:
  fDualOut = fDualOut ^ 1;
  goto LAB_002aba9f;
}

Assistant:

int Abc_CommandAbc9Reduce( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp, * pTemp2;
    int c, fVerbose = 0;
    int fUseAll = 0;
    int fDualOut = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "advh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAll ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Reduce(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseAll )
    {
        pTemp = Gia_ManEquivReduce( pAbc->pGia, fUseAll, fDualOut, 0, fVerbose );
        pTemp = Gia_ManSeqStructSweep( pTemp2 = pTemp, 1, 1, 0 );
        Gia_ManStop( pTemp2 );
    }
    else
        pTemp = Gia_ManEquivReduceAndRemap( pAbc->pGia, 1, fDualOut );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &reduce [-advh]\n" );
    Abc_Print( -2, "\t         reduces the circuit using equivalence classes\n" );
    Abc_Print( -2, "\t-a     : toggle merging all equivalences [default = %s]\n", fUseAll? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using dual-output merging [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}